

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_object.c
# Opt level: O0

lu_int basiclu_obj_get_factors
                 (basiclu_object *obj,lu_int *rowperm,lu_int *colperm,lu_int *Lcolptr,
                 lu_int *Lrowidx,double *Lvalue,lu_int *Ucolptr,lu_int *Urowidx,double *Uvalue)

{
  lu_int lVar1;
  basiclu_object *in_RDI;
  double *in_stack_00000290;
  lu_int *in_stack_00000298;
  double *in_stack_000002a0;
  lu_int *in_stack_000002a8;
  double *in_stack_000002b0;
  lu_int *in_stack_000002b8;
  lu_int *in_stack_000002d0;
  double *in_stack_000002d8;
  lu_int *in_stack_000002e0;
  lu_int *in_stack_000002e8;
  lu_int *in_stack_000002f0;
  lu_int *in_stack_000002f8;
  double *in_stack_00000300;
  lu_int *in_stack_00000308;
  lu_int *in_stack_00000310;
  double *in_stack_00000318;
  undefined4 local_34;
  
  lVar1 = isvalid(in_RDI);
  if (lVar1 == 0) {
    local_34 = -8;
  }
  else {
    local_34 = basiclu_get_factors(in_stack_000002b8,in_stack_000002b0,in_stack_000002a8,
                                   in_stack_000002a0,in_stack_00000298,in_stack_00000290,
                                   in_stack_000002d0,in_stack_000002d8,in_stack_000002e0,
                                   in_stack_000002e8,in_stack_000002f0,in_stack_000002f8,
                                   in_stack_00000300,in_stack_00000308,in_stack_00000310,
                                   in_stack_00000318);
  }
  return local_34;
}

Assistant:

lu_int basiclu_obj_get_factors(struct basiclu_object *obj,
                               lu_int rowperm[], lu_int colperm[],
                               lu_int Lcolptr[], lu_int Lrowidx[],
                               double Lvalue[], lu_int Ucolptr[],
                               lu_int Urowidx[], double Uvalue[])
{
    if (!isvalid(obj))
        return BASICLU_ERROR_invalid_object;

    return basiclu_get_factors(obj->istore, obj->xstore, obj->Li, obj->Lx,
                               obj->Ui, obj->Ux, obj->Wi, obj->Wx, rowperm,
                               colperm, Lcolptr, Lrowidx, Lvalue, Ucolptr,
                               Urowidx, Uvalue);
}